

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O0

int edipartyname_cmp(EDIPARTYNAME *a,EDIPARTYNAME *b)

{
  int iVar1;
  EDIPARTYNAME *b_local;
  EDIPARTYNAME *a_local;
  
  if (a->nameAssigner == (ASN1_STRING *)0x0) {
    if (b->nameAssigner != (ASN1_STRING *)0x0) {
      return -1;
    }
  }
  else if ((b->nameAssigner == (ASN1_STRING *)0x0) ||
          (iVar1 = ASN1_STRING_cmp((ASN1_STRING *)a->nameAssigner,(ASN1_STRING *)b->nameAssigner),
          iVar1 != 0)) {
    return -1;
  }
  iVar1 = ASN1_STRING_cmp((ASN1_STRING *)a->partyName,(ASN1_STRING *)b->partyName);
  return iVar1;
}

Assistant:

static int edipartyname_cmp(const EDIPARTYNAME *a, const EDIPARTYNAME *b) {
  // nameAssigner is optional and may be NULL.
  if (a->nameAssigner == NULL) {
    if (b->nameAssigner != NULL) {
      return -1;
    }
  } else {
    if (b->nameAssigner == NULL ||
        ASN1_STRING_cmp(a->nameAssigner, b->nameAssigner) != 0) {
      return -1;
    }
  }

  // partyName may not be NULL.
  return ASN1_STRING_cmp(a->partyName, b->partyName);
}